

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O2

bool __thiscall FM::OPNABase::SetRate(OPNABase *this,uint c,uint r,bool param_3)

{
  uint uVar1;
  uint32 uVar2;
  
  (this->super_OPNBase).clock = c >> 1;
  (this->super_OPNBase).psgrate = r;
  uVar1 = (uint)((((double)(c >> 1) / 72.0) * 8192.0) / (double)r);
  this->adplbase = uVar1;
  this->adpld = uVar1 * this->deltan >> 0x10;
  OPNBase::RebuildTimeTable(&this->super_OPNBase);
  uVar2 = 0;
  if ((this->reg22 & 8) != 0) {
    uVar2 = (&OPNBase::lfotable)[this->reg22 & 7];
  }
  this->lfodcount = uVar2;
  return true;
}

Assistant:

bool OPNABase::SetRate(uint c, uint r, bool)
{
	c /= 2;		// �]���łƂ̌݊������d�����������R�����g�A�E�g���悤

	OPNBase::Init(c, r);

	adplbase = int(8192. * (clock/72.) / r);
	adpld = deltan * adplbase >> 16;

	RebuildTimeTable();

	lfodcount = reg22 & 0x08 ? lfotable[reg22 & 7] : 0;
	return true;
}